

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

int __thiscall
rw::Material::clone(Material *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  float32 fVar1;
  FILE *__stream;
  Material *this_00;
  char *pcVar2;
  Error _e;
  Error local_20;
  
  this_00 = create();
  if (this_00 == (Material *)0x0) {
    local_20.plugin = 7;
    local_20.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
            ,0x36f);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&local_20);
  }
  else {
    this_00->color = this->color;
    (this_00->surfaceProps).diffuse = (this->surfaceProps).diffuse;
    fVar1 = (this->surfaceProps).specular;
    (this_00->surfaceProps).ambient = (this->surfaceProps).ambient;
    (this_00->surfaceProps).specular = fVar1;
    if (this->texture != (Texture *)0x0) {
      setTexture(this_00,this->texture);
    }
    this_00->pipeline = this->pipeline;
    PluginList::copy((PluginList *)&s_plglist,(EVP_PKEY_CTX *)this_00,(EVP_PKEY_CTX *)this);
  }
  return (int)this_00;
}

Assistant:

Material*
Material::clone(void)
{
	Material *mat = Material::create();
	if(mat == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	mat->color = this->color;
	mat->surfaceProps = this->surfaceProps;
	if(this->texture)
		mat->setTexture(this->texture);
	mat->pipeline = this->pipeline;
	s_plglist.copy(mat, this);
	return mat;
}